

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CServer::RegisterCommands(CServer *this)

{
  IConsole *pIVar1;
  CServer *pServer;
  IStorage *pStorage;
  CServer *in_RDI;
  IStorage *in_stack_ffffffffffffffe0;
  CDemoRecorder *this_00;
  IConsole *in_stack_ffffffffffffffe8;
  
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"kick","i[id] ?r[reason]",4,ConKick,in_RDI,
             "Kick player with specified id for any reason");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"status","",4,ConStatus,in_RDI,"List players");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"shutdown","?r[reason]",4,ConShutdown,in_RDI,"Shut down");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"logout","",0x44,ConLogout,in_RDI,"Logout of rcon");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"record","?s[file]",0xc,ConRecord,in_RDI,"Record to a file");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"stoprecord","",4,ConStopRecord,in_RDI,"Stop recording");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"reload","",4,ConMapReload,in_RDI,"Reload the map");
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_name",ConchainSpecialInfoupdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"password",ConchainSpecialInfoupdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_player_slots",ConchainPlayerSlotsUpdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_max_clients",ConchainMaxclientsUpdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_max_clients",ConchainSpecialInfoupdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_max_clients_per_ip",ConchainMaxclientsperipUpdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"mod_command",ConchainModCommandUpdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"console_output_level",ConchainConsoleOutputLevelUpdate,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])
            (pIVar1,"sv_rcon_password",ConchainRconPasswordSet,in_RDI);
  pIVar1 = Console(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,"sv_map",ConchainMapUpdate,in_RDI);
  pServer = (CServer *)Console(in_RDI);
  Storage(in_RDI);
  CServerBan::InitServerBan
            ((CServerBan *)in_RDI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,pServer);
  this_00 = &in_RDI->m_DemoRecorder;
  pIVar1 = Console(in_RDI);
  pStorage = Storage(in_RDI);
  CDemoRecorder::Init(this_00,pIVar1,pStorage);
  (*(in_RDI->m_pGameServer->super_IInterface)._vptr_IInterface[3])();
  return;
}

Assistant:

void CServer::RegisterCommands()
{
	// register console commands
	Console()->Register("kick", "i[id] ?r[reason]", CFGFLAG_SERVER, ConKick, this, "Kick player with specified id for any reason");
	Console()->Register("status", "", CFGFLAG_SERVER, ConStatus, this, "List players");
	Console()->Register("shutdown", "?r[reason]", CFGFLAG_SERVER, ConShutdown, this, "Shut down");
	Console()->Register("logout", "", CFGFLAG_SERVER|CFGFLAG_BASICACCESS, ConLogout, this, "Logout of rcon");

	Console()->Register("record", "?s[file]", CFGFLAG_SERVER|CFGFLAG_STORE, ConRecord, this, "Record to a file");
	Console()->Register("stoprecord", "", CFGFLAG_SERVER, ConStopRecord, this, "Stop recording");

	Console()->Register("reload", "", CFGFLAG_SERVER, ConMapReload, this, "Reload the map");

	Console()->Chain("sv_name", ConchainSpecialInfoupdate, this);
	Console()->Chain("password", ConchainSpecialInfoupdate, this);

	Console()->Chain("sv_player_slots", ConchainPlayerSlotsUpdate, this);
	Console()->Chain("sv_max_clients", ConchainMaxclientsUpdate, this);
	Console()->Chain("sv_max_clients", ConchainSpecialInfoupdate, this);
	Console()->Chain("sv_max_clients_per_ip", ConchainMaxclientsperipUpdate, this);
	Console()->Chain("mod_command", ConchainModCommandUpdate, this);
	Console()->Chain("console_output_level", ConchainConsoleOutputLevelUpdate, this);
	Console()->Chain("sv_rcon_password", ConchainRconPasswordSet, this);
	Console()->Chain("sv_map", ConchainMapUpdate, this);

	// register console commands in sub parts
	m_ServerBan.InitServerBan(Console(), Storage(), this);
	m_DemoRecorder.Init(Console(), Storage());
	m_pGameServer->OnConsoleInit();
}